

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::OffsetNodeMeshIndices(aiNode *node,uint offset)

{
  uint local_1c;
  uint local_18;
  uint i_1;
  uint i;
  uint offset_local;
  aiNode *node_local;
  
  for (local_18 = 0; local_18 < node->mNumMeshes; local_18 = local_18 + 1) {
    node->mMeshes[local_18] = offset + node->mMeshes[local_18];
  }
  for (local_1c = 0; local_1c < node->mNumChildren; local_1c = local_1c + 1) {
    OffsetNodeMeshIndices(node->mChildren[local_1c],offset);
  }
  return;
}

Assistant:

void SceneCombiner::OffsetNodeMeshIndices (aiNode* node, unsigned int offset) {
    for (unsigned int i = 0; i < node->mNumMeshes;++i)
        node->mMeshes[i] += offset;

    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        OffsetNodeMeshIndices( node->mChildren[ i ], offset );
    }
}